

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall
cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,uint32_t version,uint32_t lock_time)

{
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  Psbt *in_RDI;
  
  core::Psbt::Psbt(in_RDI,in_ESI,in_EDX,in_ECX);
  in_RDI->_vptr_Psbt = (_func_int **)&PTR__Psbt_009f0ca8;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x51bd9c);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, uint32_t version, uint32_t lock_time)
    : cfd::core::Psbt(psbt_version, version, lock_time) {}